

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnings.cpp
# Opt level: O0

UniValue * node::GetWarningsForRpc(Warnings *warnings,bool use_deprecated)

{
  byte bVar1;
  bool bVar2;
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  bilingual_str *message;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *__range1;
  UniValue *messages;
  iterator __end1;
  iterator __begin1;
  vector<bilingual_str,_std::allocator<bilingual_str>_> all_messages;
  UniValue *in_stack_fffffffffffffeb8;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *this;
  UniValue *in_stack_fffffffffffffec8;
  UniValue *this_00;
  uint in_stack_fffffffffffffef0;
  uint uVar3;
  undefined4 in_stack_fffffffffffffef4;
  UniValue *in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff00;
  byte bVar4;
  UniValue *this_01;
  UniValue local_b9;
  vector<bilingual_str,_std::allocator<bilingual_str>_> local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  if (bVar1 == 0) {
    uVar3 = in_stack_fffffffffffffef0 & 0xffffff;
    this = local_48;
    this_00 = in_RDI;
    this_01 = in_RDI;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    UniValue::UniValue(this_00,(VType)((ulong)in_RDI >> 0x20),(string *)in_stack_fffffffffffffec8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffeb8);
    Warnings::GetMessages((Warnings *)this_01);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::begin(this);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::end(this);
    while (bVar2 = __gnu_cxx::
                   operator==<bilingual_str_*,_std::vector<bilingual_str,_std::allocator<bilingual_str>_>_>
                             ((__normal_iterator<bilingual_str_*,_std::vector<bilingual_str,_std::allocator<bilingual_str>_>_>
                               *)in_stack_fffffffffffffec8,
                              (__normal_iterator<bilingual_str_*,_std::vector<bilingual_str,_std::allocator<bilingual_str>_>_>
                               *)this), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<bilingual_str_*,_std::vector<bilingual_str,_std::allocator<bilingual_str>_>_>
      ::operator*((__normal_iterator<bilingual_str_*,_std::vector<bilingual_str,_std::allocator<bilingual_str>_>_>
                   *)in_stack_fffffffffffffeb8);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (in_stack_fffffffffffffef8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffef4,uVar3));
      UniValue::push_back(in_RDI,in_stack_fffffffffffffec8);
      UniValue::~UniValue(in_stack_fffffffffffffeb8);
      __gnu_cxx::
      __normal_iterator<bilingual_str_*,_std::vector<bilingual_str,_std::allocator<bilingual_str>_>_>
      ::operator++((__normal_iterator<bilingual_str_*,_std::vector<bilingual_str,_std::allocator<bilingual_str>_>_>
                    *)in_stack_fffffffffffffeb8);
    }
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffffec8);
  }
  else {
    Warnings::GetMessages((Warnings *)in_RDI);
    bVar2 = std::vector<bilingual_str,_std::allocator<bilingual_str>_>::empty
                      ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                       in_stack_fffffffffffffec8);
    bVar4 = 0;
    if (bVar2) {
      in_stack_fffffffffffffec8 = &local_b9;
      std::allocator<char>::allocator();
      bVar4 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_RSI,(char *)CONCAT17(bVar1,CONCAT16(1,in_stack_ffffffffffffff00)),
                 (allocator<char> *)in_stack_fffffffffffffef8);
      this_00 = in_RDI;
    }
    else {
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::back
                ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffffeb8)
      ;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar1,CONCAT16(bVar4,in_stack_ffffffffffffff00)),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffef8);
      this_00 = in_RDI;
    }
    UniValue::
    UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (in_stack_fffffffffffffef8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffeb8);
    if ((bVar4 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffffec8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

UniValue GetWarningsForRpc(const Warnings& warnings, bool use_deprecated)
{
    if (use_deprecated) {
        const auto all_messages{warnings.GetMessages()};
        return all_messages.empty() ? "" : all_messages.back().original;
    }

    UniValue messages{UniValue::VARR};
    for (auto&& message : warnings.GetMessages()) {
        messages.push_back(std::move(message.original));
    }
    return messages;
}